

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateGeneric
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  CK_RV CVar2;
  void *pvVar3;
  SoftHSM *pSVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  Session *this_00;
  unsigned_long *puVar8;
  CryptoFactory *pCVar9;
  undefined4 extraout_var;
  long *plVar10;
  ByteString *pBVar11;
  CK_ULONG CVar12;
  CK_ULONG CVar13;
  char *format;
  CK_OBJECT_HANDLE *pCVar14;
  ulong inBitLen;
  CK_ULONG i;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  CK_RV CStack_4c0;
  CK_BBOOL isOnToken_local;
  SoftHSM *local_4b0;
  Token *local_4a8;
  CK_OBJECT_HANDLE *local_4a0;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_488;
  SymmetricKey symKey;
  ByteString kcv;
  ByteString value;
  ByteString key;
  CK_ATTRIBUTE keyAttribs [32];
  
  *phKey = 0;
  isOnToken_local = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_4a8 = Session::getToken(this_00);
  if (local_4a8 == (Token *)0x0) {
    return 5;
  }
  puVar8 = &pTemplate->ulValueLen;
  bVar16 = true;
  inBitLen = 0;
  CVar12 = ulCount;
  while (bVar17 = CVar12 != 0, CVar12 = CVar12 - 1, local_4b0 = this, bVar17) {
    if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x90) {
      if (*puVar8 != 0) {
        format = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
        iVar7 = 0x1d7d;
        goto LAB_0013b0ea;
      }
      bVar16 = false;
    }
    else if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x161) {
      if (*puVar8 != 8) {
        format = "CKA_VALUE_LEN does not have the size of CK_ULONG";
        iVar7 = 0x1d75;
        goto LAB_0013b0ea;
      }
      inBitLen = *(ulong *)puVar8[-1];
    }
    puVar8 = puVar8 + 3;
  }
  if (inBitLen == 0) {
    softHSMLog(6,"generateGeneric",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1d8a,"Missing CKA_VALUE_LEN in pTemplate");
    return 0xd0;
  }
  if (0x8000000 < inBitLen) {
    format = "bad generic key length";
    iVar7 = 0x1d91;
LAB_0013b0ea:
    softHSMLog(6,"generateGeneric",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar7,format);
    return 0x13;
  }
  local_4a0 = phKey;
  pCVar9 = CryptoFactory::i();
  iVar7 = (*pCVar9->_vptr_CryptoFactory[8])(pCVar9,1);
  plVar10 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar10 == (long *)0x0) {
    return 5;
  }
  ByteString::ByteString(&key);
  cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10,&key,inBitLen);
  if (cVar5 == '\0') {
    CStack_4c0 = 5;
    goto LAB_0013b2a0;
  }
  objClass = 4;
  keyType = 0x10;
  memset(keyAttribs,0,0x300);
  pCVar14 = local_4a0;
  keyAttribs[0].pValue = &objClass;
  keyAttribs[0].ulValueLen = 8;
  keyAttribs[1].type = 1;
  keyAttribs[1].pValue = &isOnToken_local;
  keyAttribs[1].ulValueLen = 1;
  keyAttribs[2].type = 2;
  keyAttribs[2].pValue = &isPrivate;
  keyAttribs[2].ulValueLen = 1;
  keyAttribs[3].type = 0x100;
  keyAttribs[3].pValue = &keyType;
  keyAttribs[3].ulValueLen = 8;
  CVar12 = 4;
  for (uVar15 = 0; (ulCount < 0x1d && (uVar15 < ulCount)); uVar15 = uVar15 + 1) {
    uVar1 = pTemplate->type;
    CVar13 = CVar12;
    if ((2 < uVar1) && ((uVar1 != 0x90 && (uVar1 != 0x100)))) {
      CVar13 = CVar12 + 1;
      keyAttribs[CVar12].ulValueLen = pTemplate->ulValueLen;
      pvVar3 = pTemplate->pValue;
      keyAttribs[CVar12].type = pTemplate->type;
      keyAttribs[CVar12].pValue = pvVar3;
    }
    pTemplate = pTemplate + 1;
    CVar12 = CVar13;
  }
  CStack_4c0 = 0xd1;
  if ((ulCount < 0x1d) &&
     (CStack_4c0 = CreateObject(local_4b0,hSession,keyAttribs,CVar12,local_4a0,4), CStack_4c0 == 0))
  {
    plVar10 = (long *)HandleManager::getObject(local_4b0->handleManager,*pCVar14);
    CStack_4c0 = 6;
    CVar2 = 6;
    if ((plVar10 != (long *)0x0) &&
       ((cVar5 = (**(code **)(*plVar10 + 0x50))(plVar10), CStack_4c0 = CVar2, cVar5 != '\0' &&
        (cVar5 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar5 != '\0')))) {
      OSAttribute::OSAttribute(&local_488,true);
      cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,&local_488);
      OSAttribute::~OSAttribute(&local_488);
      if (cVar5 == '\0') {
        cVar5 = '\0';
      }
      else {
        OSAttribute::OSAttribute(&local_488,0x350);
        cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,&local_488);
        OSAttribute::~OSAttribute(&local_488);
      }
      bVar17 = (bool)(**(code **)(*plVar10 + 0x20))(plVar10,0x103,0);
      if (cVar5 == '\0') {
        cVar5 = '\0';
      }
      else {
        OSAttribute::OSAttribute(&local_488,bVar17);
        cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x165,&local_488);
        OSAttribute::~OSAttribute(&local_488);
      }
      bVar6 = (**(code **)(*plVar10 + 0x20))(plVar10,0x162,0);
      if (cVar5 == '\0') {
        cVar5 = '\0';
      }
      else {
        OSAttribute::OSAttribute(&local_488,(bool)(bVar6 ^ 1));
        cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x164,&local_488);
        OSAttribute::~OSAttribute(&local_488);
      }
      ByteString::ByteString(&value);
      ByteString::ByteString(&kcv);
      SymmetricKey::SymmetricKey(&symKey,0);
      SymmetricKey::setKeyBits(&symKey,&key);
      SymmetricKey::setBitLen(&symKey,inBitLen);
      if (isPrivate == '\0') {
        pBVar11 = SymmetricKey::getKeyBits(&symKey);
        ByteString::operator=(&value,pBVar11);
        SymmetricKey::getKeyCheckValue((ByteString *)&local_488,&symKey);
        ByteString::operator=(&kcv,(ByteString *)&local_488);
      }
      else {
        pBVar11 = SymmetricKey::getKeyBits(&symKey);
        Token::encrypt(local_4a8,(char *)pBVar11,(int)&value);
        SymmetricKey::getKeyCheckValue((ByteString *)&local_488,&symKey);
        Token::encrypt(local_4a8,(char *)&local_488,(int)&kcv);
      }
      ByteString::~ByteString((ByteString *)&local_488);
      if (cVar5 != '\0') {
        OSAttribute::OSAttribute(&local_488,&value);
        cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x11,&local_488);
        OSAttribute::~OSAttribute(&local_488);
        if (bVar16) {
          if (cVar5 == '\0') goto LAB_0013b551;
          OSAttribute::OSAttribute(&local_488,&kcv);
          cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x90,&local_488);
          OSAttribute::~OSAttribute(&local_488);
          pCVar14 = local_4a0;
        }
        if (cVar5 != '\0') {
          cVar5 = (**(code **)(*plVar10 + 0x60))(plVar10);
          SymmetricKey::~SymmetricKey(&symKey);
          ByteString::~ByteString(&kcv);
          ByteString::~ByteString(&value);
          if (cVar5 != '\0') {
            CStack_4c0 = 0;
            goto LAB_0013b2a0;
          }
          goto LAB_0013b266;
        }
      }
LAB_0013b551:
      (**(code **)(*plVar10 + 0x68))(plVar10);
      SymmetricKey::~SymmetricKey(&symKey);
      ByteString::~ByteString(&kcv);
      ByteString::~ByteString(&value);
    }
  }
LAB_0013b266:
  pSVar4 = local_4b0;
  if (*pCVar14 != 0) {
    plVar10 = (long *)HandleManager::getObject(local_4b0->handleManager,*pCVar14);
    HandleManager::destroyObject(pSVar4->handleManager,*pCVar14);
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 0x70))(plVar10);
    }
    *pCVar14 = 0;
  }
LAB_0013b2a0:
  ByteString::~ByteString(&key);
  return CStack_4c0;
}

Assistant:

CK_RV SoftHSM::generateGeneric
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t keyLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				keyLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// CKA_VALUE_LEN must be specified
	if (keyLen == 0)
	{
		INFO_MSG("Missing CKA_VALUE_LEN in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Check keyLen
	if (keyLen < 1 || keyLen > 0x8000000)
	{
		INFO_MSG("bad generic key length");
		return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Generate the secret key
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;
	ByteString key;
	if (!rng->generateRandom(key, keyLen)) return CKR_GENERAL_ERROR;

        CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_GENERIC_SECRET;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
			default:
				keyAttribs[keyAttribsCount++] = pTemplate[i];
				break;
		}
	}

	if (rv == CKR_OK)
		rv = CreateObject(hSession, keyAttribs, keyAttribsCount, phKey, OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_GENERIC_SECRET_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// Generic Secret Key Attributes
			ByteString value;
			ByteString kcv;
			SymmetricKey symKey;
			symKey.setKeyBits(key);
			symKey.setBitLen(keyLen);
			if (isPrivate)
			{
				token->encrypt(symKey.getKeyBits(), value);
				token->encrypt(symKey.getKeyCheckValue(), kcv);
			}
			else
			{
				value = symKey.getKeyBits();
				kcv = symKey.getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}